

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString BracketsFormattedHexStringFrom(cpputest_ulonglong value)

{
  size_t extraout_RDX;
  char *in_RDI;
  SimpleString SVar1;
  SimpleString *in_stack_00000018;
  
  HexStringFrom((cpputest_ulonglong)in_RDI);
  BracketsFormattedHexString(in_stack_00000018);
  SimpleString::~SimpleString((SimpleString *)0x173069);
  SVar1.bufferSize_ = extraout_RDX;
  SVar1.buffer_ = in_RDI;
  return SVar1;
}

Assistant:

SimpleString BracketsFormattedHexStringFrom(cpputest_ulonglong value)
{
    return BracketsFormattedHexString(HexStringFrom(value));
}